

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O1

cupdlp_retcode
cupdlp_ruiz_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                   cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  uint len;
  uint len_00;
  int iVar1;
  int iVar2;
  cupdlp_int *pcVar3;
  cupdlp_float *pcVar4;
  int iVar5;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  long lVar6;
  cupdlp_retcode cVar7;
  ulong uVar8;
  size_t __nmemb;
  cupdlp_float cVar9;
  double dVar10;
  double dVar11;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  __nmemb = (size_t)(int)len_00;
  col_scaling = (cupdlp_float *)calloc(__nmemb,8);
  cVar7 = 1;
  if (col_scaling != (cupdlp_float *)0x0) {
    row_scaling = (cupdlp_float *)calloc((long)(int)len,8);
    if (row_scaling != (cupdlp_float *)0x0) {
      if (0 < scaling->RuizTimes) {
        iVar5 = 0;
        do {
          memset(col_scaling,0,__nmemb * 8);
          memset(row_scaling,0,(long)(int)len * 8);
          if (0 < (int)len_00) {
            uVar8 = 0;
            do {
              iVar1 = csc->colMatBeg[uVar8];
              iVar2 = csc->colMatBeg[uVar8 + 1];
              cVar9 = 0.0;
              if (iVar2 != iVar1) {
                dVar10 = GenNorm(csc->colMatElem + iVar1,iVar2 - iVar1,scaling->RuizNorm);
                if (dVar10 < 0.0) {
                  cVar9 = sqrt(dVar10);
                }
                else {
                  cVar9 = SQRT(dVar10);
                }
              }
              col_scaling[uVar8] = cVar9;
              uVar8 = uVar8 + 1;
            } while (len_00 != uVar8);
          }
          if (0 < (int)len_00) {
            uVar8 = 0;
            do {
              if ((col_scaling[uVar8] == 0.0) && (!NAN(col_scaling[uVar8]))) {
                col_scaling[uVar8] = 1.0;
              }
              uVar8 = uVar8 + 1;
            } while (len_00 != uVar8);
          }
          if (scaling->RuizNorm < INFINITY) {
            puts("Currently only support infinity norm for Ruiz scaling");
            exit(1);
          }
          if (0 < (int)len) {
            iVar1 = csc->colMatBeg[__nmemb];
            if (0 < (long)iVar1) {
              pcVar3 = csc->colMatIdx;
              pcVar4 = csc->colMatElem;
              lVar6 = 0;
              do {
                dVar10 = pcVar4[lVar6];
                dVar11 = -dVar10;
                if (-dVar10 <= dVar10) {
                  dVar11 = dVar10;
                }
                if (row_scaling[pcVar3[lVar6]] <= dVar11 && dVar11 != row_scaling[pcVar3[lVar6]]) {
                  row_scaling[pcVar3[lVar6]] = dVar11;
                }
                lVar6 = lVar6 + 1;
              } while (iVar1 != lVar6);
            }
            if (0 < (int)len) {
              uVar8 = 0;
              do {
                dVar10 = row_scaling[uVar8];
                cVar9 = 1.0;
                if ((dVar10 != 0.0) || (NAN(dVar10))) {
                  if (dVar10 < 0.0) {
                    cVar9 = sqrt(dVar10);
                  }
                  else {
                    cVar9 = SQRT(dVar10);
                  }
                }
                row_scaling[uVar8] = cVar9;
                uVar8 = uVar8 + 1;
              } while (len != uVar8);
            }
          }
          scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
          cupdlp_cdot(scaling->colScale,col_scaling,len_00);
          cupdlp_cdot(scaling->rowScale,row_scaling,len);
          iVar5 = iVar5 + 1;
        } while (iVar5 < scaling->RuizTimes);
      }
      cVar7 = 0;
      goto LAB_0038ba4d;
    }
  }
  row_scaling = (cupdlp_float *)0x0;
LAB_0038ba4d:
  free(col_scaling);
  free(row_scaling);
  return cVar7;
}

Assistant:

cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                   cupdlp_float *lower,
                                   cupdlp_float *upper, cupdlp_float *rhs,
                                   CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPwork *work, cupdlp_int max_iter,
// cupdlp_float norm)
{
  cupdlp_retcode retcode = RETCODE_OK;

  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  for (cupdlp_int i = 0; i < scaling->RuizTimes; i++) {
    cupdlp_zero(current_col_scaling, cupdlp_float, nCols);
    cupdlp_zero(current_row_scaling, cupdlp_float, nRows);

    if (csc != NULL) {
      for (int j = 0; j < nCols; j++) {
        if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
          current_col_scaling[j] = 0;
        } else {
          current_col_scaling[j] = SQRTF(GenNorm(
              &csc->colMatElem[csc->colMatBeg[j]],
              csc->colMatBeg[j + 1] - csc->colMatBeg[j], scaling->RuizNorm));
        }
      }
    }
    for (int j = 0; j < nCols; j++) {
      if (current_col_scaling[j] == 0.0) {
        current_col_scaling[j] = 1.0;
      }
    }

    if (scaling->RuizNorm == INFINITY) {
      if (nRows > 0 && csc != NULL) {
        // inf norm of rows of csc
        for (int j = 0; j < csc->colMatBeg[nCols]; j++) {
          if (current_row_scaling[csc->colMatIdx[j]] <
              ABS(csc->colMatElem[j])) {
            current_row_scaling[csc->colMatIdx[j]] = ABS(csc->colMatElem[j]);
          }
        }
        for (int j = 0; j < nRows; j++) {
          if (current_row_scaling[j] == 0.0) {
            current_row_scaling[j] = 1.0;
          } else {
            current_row_scaling[j] = SQRTF(current_row_scaling[j]);
          }
        }
      }
    } else {
      cupdlp_printf("Currently only support infinity norm for Ruiz scaling\n");
      exit(1);
    }

    // apply scaling
    // scale_problem(work, current_col_scaling, current_row_scaling);
    scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                  current_row_scaling);

    // update scaling
    cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
    cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);
  }
exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}